

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/test/catch.hpp:9762:37)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_artpaul[P]acto_test_catch_hpp:9762:37)>
          *this,string *arg)

{
  int iVar1;
  YesOrNo YVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_d8,arg);
  local_50 = 0;
  local_58 = &PTR__BasicResult_00192d38;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  toLower(&local_98,&local_d8);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"yes");
  if (iVar1 == 0) {
    YVar2 = Yes;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_98,"no");
    if (iVar1 == 0) {
      YVar2 = No;
    }
    else {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_98,"auto");
      if (iVar1 != 0) {
        ::std::operator+(&local_78,"colour mode must be one of: auto, yes or no. \'",&local_d8);
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_78,"\' not recognised");
        local_b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
        paVar4 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar4) {
          local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                  (__return_storage_ptr__,RuntimeError,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00137607;
      }
      YVar2 = Auto;
    }
  }
  ((this->m_lambda).config)->useColour = YVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00192d38;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00137607:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58 = &PTR__BasicResult_00192d38;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }